

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockContextUpdateDocking(ImGuiContext *ctx)

{
  ImVector<ImGuiStorage::ImGuiStoragePair> *this;
  bool bVar1;
  ImGuiDockRequest *pIVar2;
  ImGuiStoragePair *pIVar3;
  ImVector<ImGuiDockRequest> *in_RDI;
  ImGuiDockNode *node;
  int n_1;
  int n;
  ImGuiDockContext *dc;
  ImGuiContext *g;
  ImGuiDockRequest *in_stack_00000048;
  ImGuiContext *in_stack_00000050;
  ImGuiDockNode *in_stack_00000150;
  int in_stack_ffffffffffffffcc;
  ImVector<ImGuiDockRequest> *in_stack_ffffffffffffffd0;
  int local_20;
  int local_1c;
  
  this = *(ImVector<ImGuiStorage::ImGuiStoragePair> **)(in_RDI + 0x2ec);
  if (((ulong)in_RDI->Data & 0x40) != 0) {
    for (local_1c = 0; local_1c < this[1].Size; local_1c = local_1c + 1) {
      pIVar2 = ImVector<ImGuiDockRequest>::operator[]
                         ((ImVector<ImGuiDockRequest> *)(this + 1),local_1c);
      if (pIVar2->Type == ImGuiDockRequestType_Dock) {
        in_stack_ffffffffffffffd0 = in_RDI;
        ImVector<ImGuiDockRequest>::operator[]((ImVector<ImGuiDockRequest> *)(this + 1),local_1c);
        DockContextProcessDock(in_stack_00000050,in_stack_00000048);
      }
    }
    ImVector<ImGuiDockRequest>::resize(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    for (local_20 = 0; local_20 < this->Size; local_20 = local_20 + 1) {
      pIVar3 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[](this,local_20);
      if (((ImGuiDockNode *)(pIVar3->field_1).val_p != (ImGuiDockNode *)0x0) &&
         (bVar1 = ImGuiDockNode::IsFloatingNode((ImGuiDockNode *)(pIVar3->field_1).val_p), bVar1)) {
        DockNodeUpdate(in_stack_00000150);
      }
    }
  }
  return;
}

Assistant:

void ImGui::DockContextUpdateDocking(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc = ctx->DockContext;
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
        return;

    // Process Docking requests
    for (int n = 0; n < dc->Requests.Size; n++)
        if (dc->Requests[n].Type == ImGuiDockRequestType_Dock)
            DockContextProcessDock(ctx, &dc->Requests[n]);
    dc->Requests.resize(0);

    // Create windows for each automatic docking nodes
    // We can have NULL pointers when we delete nodes, but because ID are recycled this should amortize nicely (and our node count will never be very high)
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
            if (node->IsFloatingNode())
                DockNodeUpdate(node);
}